

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O3

ON_SubDEdgePtr
ON_SubDQuadFaceTopology_SubdivideEdge
          (ON_SubD_FixedSizeHeap *fsh,bool bUseFindOrAllocate,ON_SubDVertex *qv1,ON_SubDVertex *qv0,
          ON_SubDEdge *e0)

{
  bool bVar1;
  ON_SubDVertex *v1;
  ON_SubDEdge *e1;
  ON_SubDEdgePtr *this;
  double coefficient_value;
  ON_SubDEdgePtr ep1;
  ON_SubDEdgePtr local_38;
  
  v1 = ON_SubD_FixedSizeHeap::AllocateEdgeSubdivisionVertex(fsh,bUseFindOrAllocate,e0);
  if (v1 == (ON_SubDVertex *)0x0) {
LAB_0061c539:
    ON_SubDIncrementErrorCount();
    return (ON_SubDEdgePtr)0;
  }
  bVar1 = ON_SubDEdge::IsSmooth(e0);
  if (bVar1) {
    if (qv1->m_vertex_tag != qv0->m_vertex_tag) goto LAB_0061c539;
    if (qv1->m_vertex_tag == Smooth) goto LAB_0061c48f;
    coefficient_value = ON_SubDSectorType::CopyEdgeSectorCoefficient(e0,qv0,-1.23432101234321e+308);
    bVar1 = ON_SubDSectorType::IsValidSectorCoefficientValue(coefficient_value,false);
    if (!bVar1) goto LAB_0061c539;
  }
  else {
LAB_0061c48f:
    coefficient_value = 0.0;
  }
  local_38 = ON_SubD_FixedSizeHeap::AllocateEdge
                       (fsh,bUseFindOrAllocate,qv1,coefficient_value,v1,0.0);
  this = &local_38;
  e1 = ON_SubDEdgePtr::Edge(this);
  if (e1 != (ON_SubDEdge *)0x0) {
    if ((e1->m_edge_tag == e0->m_edge_tag) ||
       (e0->m_edge_tag == SmoothX && e1->m_edge_tag == Smooth)) {
      ON_SubDQuadFaceTopology_SetSubdividedEdgeSharpness(e0,qv0,e1,qv1);
      goto LAB_0061c4f9;
    }
  }
  ON_SubDIncrementErrorCount();
  this = &ON_SubDEdgePtr::Null;
LAB_0061c4f9:
  return (ON_SubDEdgePtr)this->m_ptr;
}

Assistant:

static const ON_SubDEdgePtr ON_SubDQuadFaceTopology_SubdivideEdge(
  ON_SubD_FixedSizeHeap& fsh,
  bool bUseFindOrAllocate,
  ON_SubDVertex* qv1,
  const ON_SubDVertex* qv0,
  const ON_SubDEdge* e0
  )
{
  if (nullptr == qv1 || nullptr == e0)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  ON_SubDVertex* v1 = fsh.AllocateEdgeSubdivisionVertex(bUseFindOrAllocate,e0);
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);

  double v0_weight;
  if ( e0->IsSmooth() && nullptr != qv0)
  {
    // qv1 is the subdivision point of qv0.
    if ( qv1->m_vertex_tag != qv0->m_vertex_tag )
      return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
    if ( ON_SubDVertexTag::Smooth == qv0->m_vertex_tag)
      v0_weight = ON_SubDSectorType::IgnoredSectorCoefficient;
    else
    {
      v0_weight = ON_SubDSectorType::CopyEdgeSectorCoefficient(e0, qv0, ON_UNSET_VALUE);
      if (false == ON_SubDSectorType::IsValidSectorCoefficientValue(v0_weight,false))
        return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
    }
  }
  else
    v0_weight = ON_SubDSectorType::IgnoredSectorCoefficient;

  const double v1_weight = ON_SubDSectorType::IgnoredSectorCoefficient;

  ON_SubDEdgePtr ep1 = fsh.AllocateEdge(bUseFindOrAllocate,qv1,v0_weight,v1,v1_weight);
  ON_SubDEdge* e1 = ep1.Edge();
  if (nullptr == e1)
    return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  if (e1->m_edge_tag != e0->m_edge_tag)
  {
    // On the first subdivision step,
    // e0 with tag ON_SubDEdgeTag::SmoothX turns into 
    // e1 with tag ON_SubDEdgeTag::Smooth.
    if ( ON_SubDEdgeTag::Smooth != e1->m_edge_tag || ON_SubDEdgeTag::SmoothX != e0->m_edge_tag)
      return ON_SUBD_RETURN_ERROR(ON_SubDEdgePtr::Null);
  }
  ON_SubDQuadFaceTopology_SetSubdividedEdgeSharpness(e0, qv0, e1, qv1);

  return ep1;
}